

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void * __thiscall LLVMBC::LLVMContext::allocate(LLVMContext *this,size_t size,size_t align)

{
  undefined8 local_28;
  void *ptr;
  size_t align_local;
  size_t size_local;
  LLVMContext *this_local;
  
  local_28 = allocate_from_chain(this,size,align);
  if (local_28 == (void *)0x0) {
    allocate_new_chain(this,size,align);
    local_28 = allocate_from_chain(this,size,align);
  }
  return local_28;
}

Assistant:

void *LLVMContext::allocate(size_t size, size_t align)
{
	void *ptr = allocate_from_chain(size, align);
	if (!ptr)
	{
		allocate_new_chain(size, align);
		ptr = allocate_from_chain(size, align);
	}
	return ptr;
}